

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O1

bool __thiscall ODDLParser::OpenDDLExport::handleNode(OpenDDLExport *this,DDLNode *node)

{
  ulong uVar1;
  pointer ppDVar2;
  DDLNode *node_00;
  DllNodeList *pDVar3;
  ulong uVar4;
  string statement;
  string local_50;
  
  if ((node != (DDLNode *)0x0) &&
     (pDVar3 = DDLNode::getChildNodeList(node),
     (pDVar3->super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>).
     _M_impl.super__Vector_impl_data._M_start !=
     (pDVar3->super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>).
     _M_impl.super__Vector_impl_data._M_finish)) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    uVar4 = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    while( true ) {
      ppDVar2 = (pDVar3->
                super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar1 = uVar4 + 1;
      if ((ulong)((long)(pDVar3->
                        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3) <= uVar1)
      break;
      node_00 = ppDVar2[uVar4 + 1];
      uVar4 = uVar1;
      if (node_00 != (DDLNode *)0x0) {
        writeNode(this,node_00,&local_50);
        handleNode(this,node_00);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return true;
}

Assistant:

bool OpenDDLExport::handleNode( DDLNode *node ) {
    if( ddl_nullptr == node ) {
        return true;
    }

    const DDLNode::DllNodeList &childs = node->getChildNodeList();
    if( childs.empty() ) {
        return true;
    }
    DDLNode *current( ddl_nullptr );
    DDLNodeIterator it( childs );
    std::string statement;
    bool success( true );
    while( it.getNext( &current ) ) {
        if( ddl_nullptr != current ) {
            success |= writeNode( current, statement );
            if( !handleNode( current ) ) {
                success = false;
            }
        }
    }

    return success;
}